

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O3

bool overlapCC(SoftCluster *c1,SoftCluster *c2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer pcVar4;
  double dVar5;
  int iVar6;
  iterator iVar7;
  pointer pSVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  pointer pSVar13;
  pointer pSVar14;
  int iVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  SoftNode sn;
  vector<SoftNode,_std::allocator<SoftNode>_> down;
  vector<SoftNode,_std::allocator<SoftNode>_> up;
  vector<SoftNode,_std::allocator<SoftNode>_> down3;
  vector<SoftNode,_std::allocator<SoftNode>_> up3;
  SoftNode n2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stDown;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stUp;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined2 local_198;
  vector<SoftNode,_std::allocator<SoftNode>_> local_188;
  vector<SoftNode,_std::allocator<SoftNode>_> local_170;
  vector<SoftNode,_std::allocator<SoftNode>_> local_158;
  vector<SoftNode,_std::allocator<SoftNode>_> local_138;
  pointer local_118;
  pointer local_110;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  string local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined2 local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  std::vector<SoftNode,std::allocator<SoftNode>>::
  vector<__gnu_cxx::__normal_iterator<SoftNode_const*,std::vector<SoftNode,std::allocator<SoftNode>>>,void>
            ((vector<SoftNode,std::allocator<SoftNode>> *)&local_170,
             (c1->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_start,
             (c1->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_208);
  std::vector<SoftNode,std::allocator<SoftNode>>::
  vector<__gnu_cxx::__normal_iterator<SoftNode_const*,std::vector<SoftNode,std::allocator<SoftNode>>>,void>
            ((vector<SoftNode,std::allocator<SoftNode>> *)&local_188,
             (c2->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_start,
             (c2->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_208);
  pSVar8 = local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar13 = local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_208 = pSVar13->scPos;
      iStack_204 = pSVar13->start;
      iStack_200 = pSVar13->end;
      iStack_1fc = pSVar13->refID;
      pcVar4 = (pSVar13->refName)._M_dataplus._M_p;
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,pcVar4,pcVar4 + (pSVar13->refName)._M_string_length);
      pcVar4 = (pSVar13->seq)._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar4,pcVar4 + (pSVar13->seq)._M_string_length);
      pcVar4 = (pSVar13->readName)._M_dataplus._M_p;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar4,pcVar4 + (pSVar13->readName)._M_string_length);
      uVar16._0_1_ = pSVar13->scAtRight;
      uVar16._1_1_ = pSVar13->isSC;
      uVar16._2_2_ = *(undefined2 *)&pSVar13->field_0x72;
      local_198 = (undefined2)uVar16;
      if ((uVar16 >> 8 & 1) == 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,&local_1b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
      }
      pSVar13 = pSVar13 + 1;
    } while (pSVar13 != pSVar8);
  }
  pSVar8 = local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar13 = local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_208 = pSVar13->scPos;
      iStack_204 = pSVar13->start;
      iStack_200 = pSVar13->end;
      iStack_1fc = pSVar13->refID;
      pcVar4 = (pSVar13->refName)._M_dataplus._M_p;
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,pcVar4,pcVar4 + (pSVar13->refName)._M_string_length);
      pcVar4 = (pSVar13->seq)._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar4,pcVar4 + (pSVar13->seq)._M_string_length);
      pcVar4 = (pSVar13->readName)._M_dataplus._M_p;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar4,pcVar4 + (pSVar13->readName)._M_string_length);
      uVar1._0_1_ = pSVar13->scAtRight;
      uVar1._1_1_ = pSVar13->isSC;
      uVar1._2_2_ = *(undefined2 *)&pSVar13->field_0x72;
      local_198 = (undefined2)uVar1;
      if ((uVar1 >> 8 & 1) == 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_90,&local_1b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
      }
      pSVar13 = pSVar13 + 1;
    } while (pSVar13 != pSVar8);
  }
  pSVar8 = local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar15 = 0;
  }
  else {
    iVar15 = 0;
    pSVar13 = local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_208 = pSVar13->scPos;
      iStack_204 = pSVar13->start;
      iStack_200 = pSVar13->end;
      iStack_1fc = pSVar13->refID;
      pcVar4 = (pSVar13->refName)._M_dataplus._M_p;
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,pcVar4,pcVar4 + (pSVar13->refName)._M_string_length);
      pcVar4 = (pSVar13->seq)._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar4,pcVar4 + (pSVar13->seq)._M_string_length);
      pcVar4 = (pSVar13->readName)._M_dataplus._M_p;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar4,pcVar4 + (pSVar13->readName)._M_string_length);
      uVar2._0_1_ = pSVar13->scAtRight;
      uVar2._1_1_ = pSVar13->isSC;
      uVar2._2_2_ = *(undefined2 *)&pSVar13->field_0x72;
      local_198 = (undefined2)uVar2;
      if ((uVar2 >> 8 & 1) != 0) {
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_90,&local_1b8);
        iVar15 = iVar15 + (uint)((_Rb_tree_header *)iVar7._M_node !=
                                &local_90._M_impl.super__Rb_tree_header);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
      }
      pSVar13 = pSVar13 + 1;
    } while (pSVar13 != pSVar8);
  }
  pSVar8 = local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar13 = local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_208 = pSVar13->scPos;
      iStack_204 = pSVar13->start;
      iStack_200 = pSVar13->end;
      iStack_1fc = pSVar13->refID;
      pcVar4 = (pSVar13->refName)._M_dataplus._M_p;
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,pcVar4,pcVar4 + (pSVar13->refName)._M_string_length);
      pcVar4 = (pSVar13->seq)._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar4,pcVar4 + (pSVar13->seq)._M_string_length);
      pcVar4 = (pSVar13->readName)._M_dataplus._M_p;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar4,pcVar4 + (pSVar13->readName)._M_string_length);
      uVar3._0_1_ = pSVar13->scAtRight;
      uVar3._1_1_ = pSVar13->isSC;
      uVar3._2_2_ = *(undefined2 *)&pSVar13->field_0x72;
      local_198 = (undefined2)uVar3;
      if ((uVar3 >> 8 & 1) != 0) {
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_60,&local_1b8);
        iVar15 = iVar15 + (uint)((_Rb_tree_header *)iVar7._M_node !=
                                &local_60._M_impl.super__Rb_tree_header);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
      }
      pSVar13 = pSVar13 + 1;
    } while (pSVar13 != pSVar8);
  }
  bVar12 = true;
  if (iVar15 < MIN_SPLIT_SUPPORT) {
    local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pSVar8 = (pointer)0x0;
    local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar16 = (int)((ulong)((long)local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
    pSVar13 = (pointer)0x0;
    do {
      uVar16 = uVar16 - 1;
      if ((int)uVar16 < 0) break;
      uVar11 = (ulong)(uVar16 & 0x7fffffff);
      uVar10 = ((long)local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
      if (uVar10 < uVar11 || uVar10 - uVar11 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar11);
      }
      if (local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11].isSC == true) {
        std::vector<SoftNode,std::allocator<SoftNode>>::emplace_back<SoftNode&>
                  ((vector<SoftNode,std::allocator<SoftNode>> *)&local_138,
                   local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar11);
        pSVar8 = local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar13 = local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
    } while ((ulong)(((long)pSVar13 - (long)pSVar8 >> 3) * -0x1111111111111111) < 3);
    uVar16 = (int)((ulong)((long)local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
    do {
      uVar16 = uVar16 - 1;
      if ((int)uVar16 < 0) break;
      uVar10 = (ulong)(uVar16 & 0x7fffffff);
      uVar11 = ((long)local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
      if (uVar11 < uVar10 || uVar11 - uVar10 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      if (local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].isSC == true) {
        std::vector<SoftNode,std::allocator<SoftNode>>::emplace_back<SoftNode&>
                  ((vector<SoftNode,std::allocator<SoftNode>> *)&local_158,
                   local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar10);
      }
    } while ((ulong)(((long)local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111) <
             3);
    local_118 = local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      dVar5 = 0.0;
      pSVar8 = local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      iVar15 = 0;
      pSVar8 = local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_1f8[0] = local_1e8;
        local_208 = pSVar8->scPos;
        iStack_204 = pSVar8->start;
        iStack_200 = pSVar8->end;
        iStack_1fc = pSVar8->refID;
        pcVar4 = (pSVar8->refName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,pcVar4,pcVar4 + (pSVar8->refName)._M_string_length);
        pcVar4 = (pSVar8->seq)._M_dataplus._M_p;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,pcVar4,pcVar4 + (pSVar8->seq)._M_string_length);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        pcVar4 = (pSVar8->readName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar4,pcVar4 + (pSVar8->readName)._M_string_length);
        pSVar13 = local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_198._0_1_ = pSVar8->scAtRight;
        local_198._1_1_ = pSVar8->isSC;
        local_110 = pSVar8;
        for (pSVar14 = local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                       super__Vector_impl_data._M_start; pSVar14 != pSVar13; pSVar14 = pSVar14 + 1)
        {
          local_108 = pSVar14->scPos;
          iStack_104 = pSVar14->start;
          iStack_100 = pSVar14->end;
          iStack_fc = pSVar14->refID;
          local_f8[0] = local_e8;
          pcVar4 = (pSVar14->refName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,pcVar4,pcVar4 + (pSVar14->refName)._M_string_length);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          pcVar4 = (pSVar14->seq)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,pcVar4,pcVar4 + (pSVar14->seq)._M_string_length);
          pcVar4 = (pSVar14->readName)._M_dataplus._M_p;
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b8,pcVar4,pcVar4 + (pSVar14->readName)._M_string_length);
          local_98._0_1_ = pSVar14->scAtRight;
          local_98._1_1_ = pSVar14->isSC;
          iVar6 = alignSeq(&local_1d8,&local_d8);
          if (local_b8[0] != local_a8) {
            operator_delete(local_b8[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0]);
          }
          iVar15 = iVar15 + iVar6;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        pSVar8 = local_110;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0]);
        }
        pSVar8 = pSVar8 + 1;
      } while (pSVar8 != local_118);
      dVar5 = (double)iVar15;
      pSVar8 = local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    lVar9 = ((long)local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x1111111111111111 +
            ((long)pSVar8 -
             (long)local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
    auVar17._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar17._0_8_ = lVar9;
    auVar17._12_4_ = 0x45300000;
    bVar12 = (double)INTRA_ALIGN_SCORE <=
             dVar5 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
    std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&local_158);
    std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&local_138);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&local_188);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&local_170);
  return bVar12;
}

Assistant:

bool overlapCC(const SoftCluster &c1, const SoftCluster &c2)
{
	int sum = 0;
	std::vector<SoftNode> up(c1.nodes.begin(), c1.nodes.end());
	std::vector<SoftNode> down(c2.nodes.begin(), c2.nodes.end());

	// check if split read already present
	std::set<std::string> stUp, stDown;
	for (SoftNode sn : up)
	{
		if (!sn.isSC)
			stUp.insert(sn.readName);
	}
	for (SoftNode sn : down)
	{
		if (!sn.isSC)
			stDown.insert(sn.readName);
	}
	int srCo = 0;
	for (SoftNode sn : up)
	{
		if (sn.isSC)
		{
			if (stDown.find(sn.readName) != stDown.end())
				srCo += 1;
		}
	}
	for (SoftNode sn : down)
	{
		if (sn.isSC)
		{
			if (stUp.find(sn.readName) != stUp.end())
				srCo += 1;
		}
	}
	if (srCo >= MIN_SPLIT_SUPPORT)
		return true;

	std::vector<SoftNode> up3, down3;
	for (int i = up.size() - 1; i >= 0; i--)
	{
		if (up.at(i).isSC)
			up3.emplace_back(up.at(i));
		if (up3.size() >= 3)
			break;
	}
	for (int i = down.size() - 1; i >= 0; i--)
	{
		if (down.at(i).isSC)
			down3.emplace_back(down.at(i));
		if (down3.size() >= 3)
			break;
	}

	for (SoftNode n1 : up3)
	{
		for (SoftNode n2 : down3)
		{
			int here = alignSeq(n1.seq, n2.seq);
			sum += here;
		}
	}
	double avgScore = 1.0 * sum / (up3.size() + down3.size());
	return avgScore >= INTRA_ALIGN_SCORE;
}